

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O0

void __thiscall zsummer::log4z::CLogerManager::~CLogerManager(CLogerManager *this)

{
  CLogerManager *this_local;
  
  ~CLogerManager(this);
  operator_delete(this,0x660);
  return;
}

Assistant:

~CLogerManager()
	{
		Stop();
	}